

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

void __thiscall Memory::HeapBlockMap32::ResetDirtyPages(HeapBlockMap32 *this,Recycler *recycler)

{
  L2MapChunk *pLVar1;
  HeapBlock *this_00;
  PageAllocatorBaseCommon *pPVar2;
  size_t sVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  IdleDecommitPageAllocator *pIVar8;
  char *pcVar9;
  long lVar10;
  Segment *pSVar11;
  char *pcVar12;
  Segment *pSVar13;
  IdleDecommitPageAllocator *pIVar14;
  char *address;
  char *pcVar15;
  long lVar16;
  
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  lVar10 = 0;
  pSVar13 = (Segment *)0x0;
  do {
    if (lVar10 == 0x1000) {
      return;
    }
    pLVar1 = this->map[lVar10];
    if (pLVar1 != (L2MapChunk *)0x0) {
      for (lVar16 = 0; lVar16 != 0x100; lVar16 = lVar16 + 1) {
        this_00 = pLVar1->map[lVar16];
        pSVar11 = pSVar13;
        if (this_00 != (HeapBlock *)0x0) {
          pSVar11 = this_00->segment;
          if (pSVar11 == (Segment *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                               ,0x240,"(block->GetSegment() != nullptr)",
                               "block->GetSegment() != nullptr");
            if (!bVar5) goto LAB_0062c728;
            *puVar7 = 0;
            pSVar11 = this_00->segment;
          }
          if (pSVar11 == pSVar13) {
            if (pSVar13 == (Segment *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x243,"(currentSegment != nullptr)","currentSegment != nullptr");
              if (!bVar5) goto LAB_0062c728;
              *puVar7 = 0;
            }
            if ((this_00->address < pSVar13->address) ||
               (pSVar11 = pSVar13,
               pSVar13->address +
               (pSVar13->segmentPageCount - (ulong)pSVar13->secondaryAllocPageCount) * 0x1000 <=
               this_00->address)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x244,"(currentSegment->IsInSegment(block->GetAddress()))",
                                 "currentSegment->IsInSegment(block->GetAddress())");
              if (!bVar5) goto LAB_0062c728;
              *puVar7 = 0;
              pSVar11 = pSVar13;
            }
          }
          else {
            if (pSVar13 != (Segment *)0x0) {
              if ((pSVar13->address <= this_00->address) &&
                 (this_00->address <
                  pSVar13->address +
                  (pSVar13->segmentPageCount - (ulong)pSVar13->secondaryAllocPageCount) * 0x1000)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar7 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                   ,0x249,
                                   "(currentSegment == nullptr || !currentSegment->IsInSegment(block->GetAddress()))"
                                   ,
                                   "currentSegment == nullptr || !currentSegment->IsInSegment(block->GetAddress())"
                                  );
                if (!bVar5) goto LAB_0062c728;
                *puVar7 = 0;
                pSVar11 = this_00->segment;
              }
            }
            if (pSVar11 == (Segment *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x24b,"(currentSegment != nullptr)","currentSegment != nullptr");
              if (!bVar5) goto LAB_0062c728;
              *puVar7 = 0;
            }
            pPVar2 = (pSVar11->super_SegmentBaseCommon).allocator;
            address = pSVar11->address;
            sVar3 = pSVar11->segmentPageCount;
            pIVar14 = (IdleDecommitPageAllocator *)&pPVar2[-1].allocatorType;
            if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
              pIVar14 = (IdleDecommitPageAllocator *)0x0;
            }
            iVar6 = (*this_00->_vptr_HeapBlock[5])(this_00);
            pIVar8 = HeapBlock::GetPageAllocator(this_00,(HeapInfo *)CONCAT44(extraout_var,iVar6));
            if (pIVar14 != pIVar8) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x251,
                                 "(segmentPageAllocator == block->GetPageAllocator(block->GetHeapInfo()))"
                                 ,
                                 "segmentPageAllocator == block->GetPageAllocator(block->GetHeapInfo())"
                                );
              if (!bVar5) goto LAB_0062c728;
              *puVar7 = 0;
            }
            pcVar15 = (char *)(sVar3 * 0x1000);
            pcVar9 = this->startAddress;
            if (address < pcVar9) {
              if (pcVar15 <= pcVar9 + -(long)address) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar7 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                   ,600,
                                   "(segmentLength > (size_t)(this->startAddress - segmentStart))",
                                   "segmentLength > (size_t)(this->startAddress - segmentStart)");
                if (!bVar5) goto LAB_0062c728;
                *puVar7 = 0;
                pcVar9 = this->startAddress;
              }
              pcVar15 = address + ((long)pcVar15 - (long)pcVar9);
              address = pcVar9;
            }
            pcVar12 = (char *)(0x100000000 - ((long)address - (long)pcVar9));
            if (pcVar15 + ((long)address - (long)pcVar9) < (char *)0x100000001) {
              pcVar12 = pcVar15;
            }
            if (((ulong)pcVar12 & 0xfff) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x26e,"(segmentLength % AutoSystemInfo::PageSize == 0)",
                                 "segmentLength % AutoSystemInfo::PageSize == 0");
              if (!bVar5) {
LAB_0062c728:
                pcVar4 = (code *)invalidInstructionException();
                (*pcVar4)();
              }
              *puVar7 = 0;
            }
            if ((pSVar11->field_0x2c & 2) != 0) {
              RecyclerWriteBarrierManager::ResetWriteBarrier(address,(ulong)pcVar12 >> 0xc);
            }
          }
        }
        pSVar13 = pSVar11;
      }
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

void
HeapBlockMap32::ResetDirtyPages(Recycler * recycler)
{
    this->ForEachSegment(recycler, [=](char * segmentStart, size_t segmentLength, Segment * segment, PageAllocator * segmentPageAllocator) {

        Assert(segmentLength % AutoSystemInfo::PageSize == 0);

#ifdef RECYCLER_WRITE_WATCH
        if (!CONFIG_FLAG(ForceSoftwareWriteBarrier))
        {
            if (segmentPageAllocator->IsWriteWatchEnabled())
            {
                // Call ResetWriteWatch for Small non-leaf and Large segments.
                UINT ret = ::ResetWriteWatch(segmentStart, segmentLength);
                Assert(ret == 0);
            }
        }
#endif

#ifdef RECYCLER_WRITE_BARRIER
#if defined(TARGET_64)
        if (segment->IsWriteBarrierEnabled())
#endif
        {
            // Reset software write barrier for barrier segments.
            RecyclerWriteBarrierManager::ResetWriteBarrier(segmentStart, segmentLength / AutoSystemInfo::PageSize);
        }
#endif
    });
}